

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SessionTicketThreads_Test::TestBody
          (SSLVersionTest_SessionTicketThreads_Test *this)

{
  undefined8 uVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  bool bVar4;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar5;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var8;
  ulong uVar9;
  anon_class_8_1_e77a0050_for__M_head_impl *__args;
  anon_class_8_1_e77a0050_for__M_head_impl *__args_00;
  anon_class_16_2_e5bd8862_for__M_head_impl *__args_01;
  anon_class_16_2_e5bd8862_for__M_head_impl *__args_02;
  anon_class_16_2_e5bd8863_for__M_head_impl *__args_03;
  anon_class_16_2_e5bd8863_for__M_head_impl *extraout_RDX;
  anon_class_16_2_e5bd8863_for__M_head_impl *extraout_RDX_00;
  anon_class_16_2_e5bd8863_for__M_head_impl *__args_04;
  anon_class_16_2_e5bd8863_for__M_head_impl *extraout_RDX_01;
  anon_class_16_2_e5bd8863_for__M_head_impl *extraout_RDX_02;
  anon_class_16_2_e5bd8863_for__M_head_impl *__args_05;
  anon_class_16_2_e5bd8863_for__M_head_impl *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var12;
  ulong uVar13;
  char *in_R9;
  thread *thread;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var14;
  long lVar15;
  long lVar16;
  ScopedTrace gtest_trace_6663;
  bool renew_ticket;
  anon_class_8_1_8991fb9c connect_with_session;
  UniquePtr<SSL_SESSION> session2;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  UniquePtr<SSL_SESSION> session1;
  ScopedTrace local_da;
  bool local_d9;
  thread local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  thread local_c8;
  undefined1 local_c0 [8];
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  size_type sStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined8 local_68;
  id local_58;
  undefined2 local_4a;
  _Head_base<0UL,_ssl_session_st_*,_false> local_48;
  long *local_40;
  AssertHelper local_38;
  
  local_4a = 0x100;
  lVar16 = 0;
  local_58._M_thread = (native_handle_type)this;
  while( true ) {
    local_d9 = *(bool *)((long)&local_4a + lVar16);
    testing::ScopedTrace::ScopedTrace<bool>
              (&local_da,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1a07,&local_d9);
    bVar4 = testing::internal::AlwaysTrue();
    if (!bVar4) break;
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_b8);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      SSLVersionTest::ResetContexts((SSLVersionTest *)local_58._M_thread);
    }
    uVar2 = local_b8[8];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_b8);
    if (uVar2 != '\0') break;
    SSL_CTX_set_session_cache_mode
              ((((UniquePtr<SSL_CTX> *)(local_58._M_thread + 0x38))->_M_t).
               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
    SSL_CTX_set_session_cache_mode
              ((((UniquePtr<SSL_CTX> *)(local_58._M_thread + 0x30))->_M_t).
               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
    if (local_d9 == true) {
      SSL_CTX_set_tlsext_ticket_key_cb
                ((((UniquePtr<SSL_CTX> *)(local_58._M_thread + 0x30))->_M_t).
                 super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,RenewTicketCallback);
    }
    local_a8._8_8_ = 0;
    local_98._8_8_ = 0;
    sStack_80 = 0;
    local_78._8_8_ = 0;
    local_b8._0_8_ =
         (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x0;
    local_b8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_a8._M_allocated_capacity = (size_type)&local_98;
    local_98._M_allocated_capacity = 0;
    local_78._M_allocated_capacity = 0;
    local_68._0_4_ = 0;
    local_68._4_1_ = false;
    local_68._5_3_ = 0;
    local_88._M_p = (pointer)&local_78;
    CreateClientSession((anon_unknown_0 *)&local_48,
                        (((UniquePtr<SSL_CTX> *)(local_58._M_thread + 0x38))->_M_t).
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                        (((UniquePtr<SSL_CTX> *)(local_58._M_thread + 0x30))->_M_t).
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                        (ClientConfig *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_p != &local_78) {
      operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != &local_98) {
      operator_delete((void *)local_a8._0_8_,local_98._M_allocated_capacity + 1);
    }
    local_d8._M_id._M_thread._0_1_ = local_48._M_head_impl != (ssl_session_st *)0x0;
    local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_48._M_head_impl == (ssl_session_st *)0x0) {
      testing::Message::Message((Message *)local_c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_b8,(internal *)&local_d8,(AssertionResult *)0x33e581,"false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1a12,(char *)local_b8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)local_c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._0_8_ != &local_a8) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
      }
      if (local_c0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c0 + 8))();
      }
      if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d0,local_d0);
      }
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_48);
      goto LAB_001b181c;
    }
    local_a8._8_8_ = 0;
    local_98._8_8_ = 0;
    sStack_80 = 0;
    local_78._8_8_ = 0;
    local_b8._0_8_ =
         (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x0;
    local_b8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_a8._M_allocated_capacity = (size_type)&local_98;
    local_98._M_allocated_capacity = 0;
    local_78._M_allocated_capacity = 0;
    local_68._0_4_ = 0;
    local_68._4_1_ = false;
    local_68._5_3_ = 0;
    local_88._M_p = (pointer)&local_78;
    CreateClientSession((anon_unknown_0 *)local_c0,
                        (((UniquePtr<SSL_CTX> *)(local_58._M_thread + 0x38))->_M_t).
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                        (((UniquePtr<SSL_CTX> *)(local_58._M_thread + 0x30))->_M_t).
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                        (ClientConfig *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_p != &local_78) {
      operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != &local_98) {
      operator_delete((void *)local_a8._0_8_,local_98._M_allocated_capacity + 1);
    }
    local_40 = (long *)local_c0;
    local_d8._M_id._M_thread._0_1_ = local_c0 != (undefined1  [8])0x0;
    local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_c0 == (undefined1  [8])0x0) {
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_b8,(internal *)&local_d8,(AssertionResult *)0x33e592,"false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1a15,(char *)local_b8._0_8_);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._0_8_ != &local_a8) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
      }
      if (local_c8._M_id._M_thread != 0) {
        (**(code **)(*(long *)local_c8._M_id._M_thread + 8))();
      }
      if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d0,local_d0);
      }
    }
    else {
      local_c8._M_id._M_thread = (id)(id)local_58._M_thread;
      local_b8._0_8_ =
           (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
      local_b8._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
      local_a8._0_8_ = (pointer)0x0;
      uVar5._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )__gnu_cxx::new_allocator<std::thread>::allocate
                       ((new_allocator<std::thread> *)local_b8,1,(void *)0x0);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__0>
                ((allocator_type *)
                 uVar5._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl,&local_c8,__args);
      local_b8._8_8_ =
           (long)uVar5._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl + 8;
      local_b8._0_8_ =
           uVar5._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      local_a8._M_allocated_capacity = local_b8._8_8_;
      uVar6._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )__gnu_cxx::new_allocator<std::thread>::allocate
                       ((new_allocator<std::thread> *)local_b8,2,(void *)0x0);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__1>
                ((allocator_type *)
                 ((long)uVar6._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl + 8),&local_c8,__args_00);
      *(native_handle_type *)
       uVar6._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl =
           (native_handle_type)
           *(id *)uVar5._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      *(undefined8 *)
       uVar5._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl = 0;
      operator_delete((void *)uVar5._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl,
                      local_a8._0_8_ -
                      (long)uVar5._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
      local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
      local_d8._M_id._M_thread = (id)(id)&local_c8;
      local_b8._0_8_ =
           uVar6._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      local_b8._8_8_ =
           (stack_st_CRYPTO_BUFFER *)
           ((long)uVar6._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 0x10);
      local_a8._M_allocated_capacity =
           (size_type)
           (stack_st_CRYPTO_BUFFER *)
           ((long)uVar6._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 0x10);
      uVar5._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )__gnu_cxx::new_allocator<std::thread>::allocate
                       ((new_allocator<std::thread> *)local_b8,4,(void *)0x0);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__2>
                ((allocator_type *)
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)uVar5._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 0x10))->_M_local_buf,&local_d8,__args_01);
      lVar15 = 0;
      do {
        *(undefined8 *)
         ((long)uVar5._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl + lVar15) =
             *(undefined8 *)
              ((long)uVar6._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + lVar15);
        *(undefined8 *)
         ((long)uVar6._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl + lVar15) = 0;
        lVar15 = lVar15 + 8;
      } while (lVar15 != 0x10);
      operator_delete((void *)uVar6._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl,
                      local_a8._0_8_ -
                      (long)uVar6._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
      local_a8._M_allocated_capacity =
           (long)uVar5._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl + 0x20;
      local_d8._M_id._M_thread = (id)&local_c8;
      local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
      local_b8._0_8_ =
           uVar5._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      local_b8._8_8_ =
           (allocator_type *)
           ((long)uVar5._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 0x18);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__3>
                ((allocator_type *)
                 ((long)uVar5._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl + 0x18),&local_d8,__args_02);
      uVar3 = local_a8._0_8_;
      uVar1 = local_b8._0_8_;
      local_b8._8_8_ = local_b8._8_8_ + 8;
      local_d8._M_id._M_thread = (id)&local_c8;
      local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
      if (local_b8._8_8_ == local_a8._0_8_) {
        if (local_a8._0_8_ - local_b8._0_8_ == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar11 = (long)(local_a8._0_8_ - local_b8._0_8_) >> 3;
        uVar9 = uVar11 + (uVar11 == 0);
        uVar13 = uVar9 + uVar11;
        if (0xffffffffffffffe < uVar13) {
          uVar13 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar9,uVar11)) {
          uVar13 = 0xfffffffffffffff;
        }
        if (uVar13 == 0) {
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
          __args_04 = __args_03;
        }
        else {
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)__gnu_cxx::new_allocator<std::thread>::allocate
                                ((new_allocator<std::thread> *)local_b8,uVar13,(void *)0x0);
          __args_04 = extraout_RDX_00;
        }
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__4>
                  ((allocator_type *)((long)paVar7 + uVar11 * 8),&local_d8,__args_04);
        paVar10 = paVar7;
        for (_Var8._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl =
                  (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )uVar1;
            _Var8._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )uVar3; _Var8._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl =
                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )((long)_Var8._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl + 8)) {
          paVar10->_M_allocated_capacity =
               ((native_handle_type)
               *(id *)_Var8._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl)._M_thread;
          *(id *)_Var8._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl = (id)0x0;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar10->_M_local_buf + 8);
        }
        __args_05 = extraout_RDX_01;
        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )uVar1 !=
            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          operator_delete((void *)uVar1,local_a8._0_8_ - uVar1);
          __args_05 = extraout_RDX_02;
        }
        local_a8._M_allocated_capacity = (long)paVar7 + uVar13 * 8;
        local_b8._0_8_ = paVar7;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__4>
                  ((allocator_type *)local_b8._8_8_,&local_d8,__args_03);
        __args_05 = extraout_RDX;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._8_8_;
      }
      uVar3 = local_a8._0_8_;
      uVar1 = local_b8._0_8_;
      local_b8._8_8_ = paVar10->_M_local_buf + 8;
      local_d8._M_id._M_thread = (id)&local_c8;
      local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
      if (local_b8._8_8_ == local_a8._0_8_) {
        if (local_a8._0_8_ - local_b8._0_8_ == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar11 = (long)(local_a8._0_8_ - local_b8._0_8_) >> 3;
        uVar9 = uVar11 + (uVar11 == 0);
        uVar13 = uVar9 + uVar11;
        if (0xffffffffffffffe < uVar13) {
          uVar13 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar9,uVar11)) {
          uVar13 = 0xfffffffffffffff;
        }
        if (uVar13 == 0) {
          _Var14._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        else {
          _Var14._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __gnu_cxx::new_allocator<std::thread>::allocate
                         ((new_allocator<std::thread> *)local_b8,uVar13,(void *)0x0);
          __args_05 = extraout_RDX_03;
        }
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__5>
                  ((allocator_type *)(_Var14._M_head_impl + uVar11 * 8),&local_d8,__args_05);
        _Var12._M_head_impl = _Var14._M_head_impl;
        for (paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)uVar1;
            paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)uVar3;
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar7->_M_local_buf + 8)) {
          *(size_type *)_Var12._M_head_impl = paVar7->_M_allocated_capacity;
          paVar7->_M_allocated_capacity = 0;
          _Var12._M_head_impl = _Var12._M_head_impl + 8;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar1 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)uVar1,local_a8._0_8_ - uVar1);
        }
        local_a8._M_allocated_capacity = (size_type)(_Var14._M_head_impl + uVar13 * 8);
        local_b8._0_8_ = _Var14._M_head_impl;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__5>
                  ((allocator_type *)local_b8._8_8_,&local_d8,__args_05);
        _Var12._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_b8._8_8_;
      }
      local_b8._8_8_ = (long)_Var12._M_head_impl + 8;
      for (_Var14._M_head_impl =
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_b8._0_8_;
          _Var14._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)_Var12._M_head_impl + 8); _Var14._M_head_impl = _Var14._M_head_impl + 8) {
        std::thread::join();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_b8);
    }
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_c0);
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_48);
    testing::ScopedTrace::~ScopedTrace(&local_da);
    if (local_40 == (long *)0x0) {
      return;
    }
    lVar16 = lVar16 + 1;
    if (lVar16 == 2) {
      return;
    }
  }
  testing::Message::Message((Message *)local_b8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_d8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
             ,0x1a08,
             "Expected: ResetContexts() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(((native_handle_type)*(id *)local_b8._0_8_)._M_thread + 8))();
  }
LAB_001b181c:
  testing::ScopedTrace::~ScopedTrace(&local_da);
  return;
}

Assistant:

TEST_P(SSLVersionTest, SessionTicketThreads) {
  for (bool renew_ticket : {false, true}) {
    SCOPED_TRACE(renew_ticket);
    ASSERT_NO_FATAL_FAILURE(ResetContexts());
    SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
    SSL_CTX_set_session_cache_mode(server_ctx_.get(), SSL_SESS_CACHE_BOTH);
    if (renew_ticket) {
      SSL_CTX_set_tlsext_ticket_key_cb(server_ctx_.get(), RenewTicketCallback);
    }

    // Establish two client sessions to test with.
    bssl::UniquePtr<SSL_SESSION> session1 =
        CreateClientSession(client_ctx_.get(), server_ctx_.get());
    ASSERT_TRUE(session1);
    bssl::UniquePtr<SSL_SESSION> session2 =
        CreateClientSession(client_ctx_.get(), server_ctx_.get());
    ASSERT_TRUE(session2);

    auto connect_with_session = [&](SSL_SESSION *session) {
      ClientConfig config;
      config.session = session;
      UniquePtr<SSL> client, server;
      ASSERT_TRUE(ConnectClientAndServer(&client, &server, client_ctx_.get(),
                                         server_ctx_.get(), config));
    };

    // Resume sessions in parallel with establishing new ones.
    {
      std::vector<std::thread> threads;
      threads.emplace_back([&] { connect_with_session(nullptr); });
      threads.emplace_back([&] { connect_with_session(nullptr); });
      threads.emplace_back([&] { connect_with_session(session1.get()); });
      threads.emplace_back([&] { connect_with_session(session1.get()); });
      threads.emplace_back([&] { connect_with_session(session2.get()); });
      threads.emplace_back([&] { connect_with_session(session2.get()); });
      for (auto &thread : threads) {
        thread.join();
      }
    }
  }
}